

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

void __thiscall f8n::prefs::Preferences::SetString(Preferences *this,char *key,char *value)

{
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0x11])(this,local_38,value);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Preferences::SetString(const char* key, const char* value) {
    this->SetString(std::string(key), value);
}